

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

void __thiscall capnp::_::BuilderArena::LocalCapTable::dropCap(LocalCapTable *this,uint index)

{
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar1;
  Disposer *pDVar2;
  ClientHook *pCVar3;
  uint index_local;
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  Fault f;
  
  _kjCondition.left = &index_local;
  _kjCondition.right = (long)(this->capTable).builder.pos - (long)(this->capTable).builder.ptr >> 4;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = index < _kjCondition.right;
  index_local = index;
  if (index < _kjCondition.right) {
    pMVar1 = (this->capTable).builder.ptr;
    pDVar2 = pMVar1[index].ptr.disposer;
    pCVar3 = pMVar1[index].ptr.ptr;
    pMVar1[index].ptr.disposer = (Disposer *)0x0;
    pMVar1[index].ptr.ptr = (ClientHook *)0x0;
    if (pCVar3 != (ClientHook *)0x0) {
      (**pDVar2->_vptr_Disposer)(pDVar2,pCVar3 + *(long *)(*(long *)pCVar3 + -0x10));
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&,char_const(&)[42]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
               ,0x180,FAILED,"index < capTable.size()",
               "_kjCondition,\"Invalid capability descriptor in message.\"",&_kjCondition,
               (char (*) [42])"Invalid capability descriptor in message.");
    kj::_::Debug::Fault::~Fault(&f);
  }
  return;
}

Assistant:

void BuilderArena::LocalCapTable::dropCap(uint index) {
#if CAPNP_LITE
  KJ_UNIMPLEMENTED("no cap tables in lite mode");
#else
  KJ_ASSERT(index < capTable.size(), "Invalid capability descriptor in message.") {
    return;
  }
  capTable[index] = kj::none;
#endif
}